

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3GetTempRange(Parse *pParse,int nReg)

{
  byte bVar1;
  int iVar2;
  
  if (nReg != 1) {
    if (pParse->nRangeReg < nReg) {
      iVar2 = pParse->nMem;
      pParse->nMem = nReg + iVar2;
      return iVar2 + 1;
    }
    iVar2 = pParse->iRangeReg;
    pParse->iRangeReg = nReg + iVar2;
    pParse->nRangeReg = pParse->nRangeReg - nReg;
    return iVar2;
  }
  if (pParse->nTempReg != '\0') {
    bVar1 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar1;
    return pParse->aTempReg[bVar1];
  }
  iVar2 = pParse->nMem + 1;
  pParse->nMem = iVar2;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetTempRange(Parse *pParse, int nReg){
  int i, n;
  if( nReg==1 ) return sqlite3GetTempReg(pParse);
  i = pParse->iRangeReg;
  n = pParse->nRangeReg;
  if( nReg<=n ){
    assert( !usedAsColumnCache(pParse, i, i+n-1) );
    pParse->iRangeReg += nReg;
    pParse->nRangeReg -= nReg;
  }else{
    i = pParse->nMem+1;
    pParse->nMem += nReg;
  }
  return i;
}